

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSatLE.c
# Opt level: O2

int Sle_SetCutIsContainedOrder(int *pBase,int *pCut)

{
  long lVar1;
  long lVar2;
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  
  uVar4 = *pBase & 0xf;
  uVar3 = *pCut & 0xf;
  if (uVar4 == uVar3) {
    uVar5 = 0;
    do {
      if (uVar4 == uVar5) {
        return 1;
      }
      lVar1 = uVar5 + 1;
      lVar2 = uVar5 + 1;
      uVar5 = uVar5 + 1;
    } while (pBase[lVar1] == pCut[lVar2]);
  }
  else {
    if (uVar4 <= uVar3) {
      __assert_fail("nSizeB > nSizeC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSatLE.c"
                    ,0x83,"int Sle_SetCutIsContainedOrder(int *, int *)");
    }
    if (uVar3 == 0) {
      return 1;
    }
    uVar6 = 0;
    for (uVar5 = 0; (uVar4 != uVar5 && (pBase[uVar5 + 1] <= pCut[(long)(int)uVar6 + 1]));
        uVar5 = uVar5 + 1) {
      if ((pBase[uVar5 + 1] == pCut[(long)(int)uVar6 + 1]) && (uVar6 = uVar6 + 1, uVar6 == uVar3)) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static inline int Sle_SetCutIsContainedOrder( int * pBase, int * pCut ) // check if pCut is contained in pBase
{
    int i, nSizeB = Sle_CutSize(pBase);
    int k, nSizeC = Sle_CutSize(pCut);
    int * pLeaveB = Sle_CutLeaves(pBase);
    int * pLeaveC = Sle_CutLeaves(pCut);
    if ( nSizeB == nSizeC )
    {
        for ( i = 0; i < nSizeB; i++ )
            if ( pLeaveB[i] != pLeaveC[i] )
                return 0;
        return 1;
    }
    assert( nSizeB > nSizeC ); 
    if ( nSizeC == 0 )
        return 1;
    for ( i = k = 0; i < nSizeB; i++ )
    {
        if ( pLeaveB[i] > pLeaveC[k] )
            return 0;
        if ( pLeaveB[i] == pLeaveC[k] )
        {
            if ( ++k == nSizeC )
                return 1;
        }
    }
    return 0;
}